

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte bVar1;
  undefined2 uVar2;
  uint uVar3;
  BIT_DStream_status BVar4;
  BIT_DStream_status BVar5;
  BIT_DStream_status BVar6;
  BIT_DStream_status BVar7;
  int iVar8;
  size_t sVar9;
  BYTE *pBVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 *puVar15;
  ulong *puVar16;
  uint uVar17;
  ulong srcSize;
  undefined1 *puVar18;
  uint uVar19;
  long lVar20;
  ulong srcSize_00;
  void *pvVar21;
  uint uVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  bool bVar28;
  size_t sStack_1c0;
  BIT_DStream_t BStack_198;
  undefined1 *puStack_170;
  undefined1 auStack_168 [16];
  size_t *psStack_158;
  size_t *psStack_150;
  size_t *psStack_148;
  undefined1 auStack_138 [8];
  BYTE *pBStack_130;
  size_t *psStack_128;
  size_t *psStack_120;
  size_t *psStack_118;
  undefined1 *puStack_108;
  size_t sStack_100;
  undefined1 *puStack_f8;
  uint uStack_ec;
  undefined1 *puStack_e8;
  uint uStack_dc;
  undefined1 *puStack_d8;
  undefined1 *puStack_d0;
  HUF_DecompressFastArgs HStack_c8;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar9 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar9;
  }
  sStack_100 = maxDstSize;
  if ((flags & 0x20U) == 0) {
    sVar9 = HUF_DecompressFastArgs_init(&HStack_c8,dst,maxDstSize,cSrc,cSrcSize,DTable);
    if (sVar9 - 1 < 0xffffffffffffff88) {
      if (HStack_c8.ip[0] < HStack_c8.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      pBVar23 = (BYTE *)((long)cSrc + 6);
      pBVar10 = (BYTE *)(sStack_100 + (long)dst);
      BStack_198.bitContainer = HStack_c8.bits[0];
      BStack_198._8_8_ = HStack_c8.bits[1];
      BStack_198.ptr = (char *)HStack_c8.bits[2];
      BStack_198.start = (char *)HStack_c8.bits[3];
      auStack_168._0_8_ = HStack_c8.ip[0];
      auStack_168._8_8_ = HStack_c8.ip[1];
      psStack_158 = (size_t *)HStack_c8.ip[2];
      psStack_150 = (size_t *)HStack_c8.ip[3];
      auStack_138 = (undefined1  [8])HStack_c8.op[0];
      pBStack_130 = HStack_c8.op[1];
      psStack_128 = (size_t *)HStack_c8.op[2];
      psStack_120 = (size_t *)HStack_c8.op[3];
      lVar20 = 0;
      while( true ) {
        while (lVar20 != 4) {
          pBVar24 = HStack_c8.oend;
          if (lVar20 != 3) {
            pBVar24 = (&pBStack_130)[lVar20];
          }
          if (pBVar24 < *(BYTE **)(auStack_138 + lVar20 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar13 = lVar20 * 8;
          lVar20 = lVar20 + 1;
          if (*(BYTE **)(auStack_168 + lVar13) < HStack_c8.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
        }
        uVar11 = (ulong)((long)HStack_c8.oend - (long)psStack_120) / 5;
        uVar12 = (ulong)(auStack_168._0_8_ - (long)HStack_c8.ilimit) / 7;
        if (uVar11 < uVar12) {
          uVar12 = uVar11;
        }
        if (((((long)(uVar12 * 5) < 0x14) || ((ulong)auStack_168._8_8_ < (ulong)auStack_168._0_8_))
            || (psStack_158 < (ulong)auStack_168._8_8_)) || (psStack_150 < psStack_158)) break;
        pBVar24 = (BYTE *)((long)psStack_120 + uVar12 * 5);
        lVar13 = 0;
        do {
          for (; lVar13 != 5; lVar13 = lVar13 + 1) {
            for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
              uVar2 = *(undefined2 *)
                       ((long)HStack_c8.dt + ((&BStack_198.bitContainer)[lVar20] >> 0x35) * 2);
              (&BStack_198.bitContainer)[lVar20] =
                   (&BStack_198.bitContainer)[lVar20] << ((byte)uVar2 & 0x3f);
              *(char *)(*(long *)(auStack_138 + lVar20 * 8) + lVar13) = (char)((ushort)uVar2 >> 8);
            }
          }
          for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
            uVar3 = ZSTD_countTrailingZeros64((&BStack_198.bitContainer)[lVar20]);
            *(long *)(auStack_138 + lVar20 * 8) = *(long *)(auStack_138 + lVar20 * 8) + 5;
            puVar16 = (ulong *)(*(long *)(auStack_168 + lVar20 * 8) - (ulong)(uVar3 >> 3));
            *(ulong **)(auStack_168 + lVar20 * 8) = puVar16;
            (&BStack_198.bitContainer)[lVar20] = (*puVar16 | 1) << ((byte)uVar3 & 7);
          }
          lVar20 = 0;
          lVar13 = 0;
        } while (psStack_120 < pBVar24);
      }
      HStack_c8.bits[2] = (U64)BStack_198.ptr;
      HStack_c8.bits[3] = (U64)BStack_198.start;
      HStack_c8.bits[0] = BStack_198.bitContainer;
      HStack_c8.bits[1] = BStack_198._8_8_;
      HStack_c8.ip[0] = (BYTE *)auStack_168._0_8_;
      HStack_c8.ip[1] = (BYTE *)auStack_168._8_8_;
      HStack_c8.ip[2] = (BYTE *)psStack_158;
      HStack_c8.ip[3] = (BYTE *)psStack_150;
      HStack_c8.op[2] = (BYTE *)psStack_128;
      HStack_c8.op[3] = (BYTE *)psStack_120;
      HStack_c8.op[0] = (BYTE *)auStack_138;
      HStack_c8.op[1] = pBStack_130;
      if ((ulong)auStack_168._0_8_ < pBVar23) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if ((ulong)auStack_168._8_8_ < pBVar23) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (psStack_158 < pBVar23) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (psStack_150 < pBVar23) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (pBVar10 < psStack_120) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar12 = sStack_100 + 3 >> 2;
      lVar20 = 0;
      do {
        if (lVar20 == 4) {
          if (sStack_100 != 0) {
            return sStack_100;
          }
          __assert_fail("dstSize != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                        ,0x348,
                        "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                       );
        }
        uVar11 = (long)pBVar10 - (long)dst;
        dst = (BYTE *)((long)dst + uVar12);
        if (uVar11 < uVar12) {
          dst = pBVar10;
        }
        sVar9 = HUF_initRemainingDStream(&BStack_198,&HStack_c8,(int)lVar20,(BYTE *)dst);
        if (0xffffffffffffff88 < sVar9) {
          return sVar9;
        }
        pBVar23 = HStack_c8.op[lVar20];
        lVar13 = (long)dst - (long)pBVar23;
        if (lVar13 < 4) {
          if (BStack_198.bitsConsumed < 0x41) {
            if (BStack_198.ptr < BStack_198.limitPtr) {
              if (BStack_198.ptr != BStack_198.start) {
                uVar3 = (int)BStack_198.ptr - (int)BStack_198.start;
                if (BStack_198.start <=
                    (U64 *)((long)BStack_198.ptr - (ulong)(BStack_198.bitsConsumed >> 3))) {
                  uVar3 = BStack_198.bitsConsumed >> 3;
                }
                BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)uVar3);
                BStack_198.bitsConsumed = BStack_198.bitsConsumed + uVar3 * -8;
                BStack_198.bitContainer = *(U64 *)BStack_198.ptr;
              }
            }
            else {
              BIT_reloadDStreamFast(&BStack_198);
            }
          }
        }
        else {
          uVar3 = BStack_198.bitsConsumed;
          while (uVar3 < 0x41) {
            if (BStack_198.ptr < BStack_198.limitPtr) {
              if (BStack_198.ptr == BStack_198.start) break;
              bVar28 = (U64 *)((long)BStack_198.ptr - (ulong)(uVar3 >> 3)) < BStack_198.start;
              uVar17 = (int)BStack_198.ptr - (int)BStack_198.start;
              if (!bVar28) {
                uVar17 = uVar3 >> 3;
              }
              BVar7 = (BIT_DStream_status)bVar28;
              BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)uVar17);
              BStack_198.bitsConsumed = uVar3 + uVar17 * -8;
              BStack_198.bitContainer = *(U64 *)BStack_198.ptr;
            }
            else {
              BVar7 = BIT_reloadDStreamFast(&BStack_198);
            }
            if (((BYTE *)((long)dst + -3) <= pBVar23) || (BVar7 != BIT_DStream_unfinished)) break;
            uVar11 = (BStack_198.bitContainer << ((byte)BStack_198.bitsConsumed & 0x3f)) >> 0x35;
            iVar8 = *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_198.bitsConsumed;
            *pBVar23 = *(BYTE *)((long)DTable + uVar11 * 2 + 5);
            uVar11 = (BStack_198.bitContainer << ((byte)iVar8 & 0x3f)) >> 0x35;
            iVar8 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar8;
            pBVar23[1] = *(BYTE *)((long)DTable + uVar11 * 2 + 5);
            uVar11 = (BStack_198.bitContainer << ((byte)iVar8 & 0x3f)) >> 0x35;
            iVar8 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar8;
            pBVar23[2] = *(BYTE *)((long)DTable + uVar11 * 2 + 5);
            uVar11 = (BStack_198.bitContainer << ((byte)iVar8 & 0x3f)) >> 0x35;
            uVar3 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 4) + iVar8;
            BStack_198.bitsConsumed = uVar3;
            pBVar23[3] = *(BYTE *)((long)DTable + uVar11 * 2 + 5);
            pBVar23 = pBVar23 + 4;
          }
        }
        for (; pBVar23 < dst; pBVar23 = pBVar23 + 1) {
          uVar11 = (BStack_198.bitContainer << ((byte)BStack_198.bitsConsumed & 0x3f)) >> 0x35;
          BStack_198.bitsConsumed =
               *(byte *)((long)DTable + uVar11 * 2 + 4) + BStack_198.bitsConsumed;
          *pBVar23 = *(BYTE *)((long)DTable + uVar11 * 2 + 5);
        }
        pBVar23 = HStack_c8.op[lVar20];
        HStack_c8.op[lVar20] = pBVar23 + lVar13;
        lVar20 = lVar20 + 1;
        if (pBVar23 + lVar13 != (BYTE *)dst) {
          return 0xffffffffffffffec;
        }
      } while( true );
    }
    if (sVar9 != 0) {
      return sVar9;
    }
  }
  if (cSrcSize < 10) {
    sStack_1c0 = 0xffffffffffffffec;
  }
  else {
    srcSize_00 = (ulong)*cSrc;
    srcSize = (ulong)*(ushort *)((long)cSrc + 2);
    uVar11 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar12 = srcSize_00 + srcSize + uVar11 + 6;
    sStack_1c0 = 0xffffffffffffffec;
    if ((5 < sStack_100) && (uVar12 <= cSrcSize)) {
      puStack_d8 = (undefined1 *)((long)dst + sStack_100);
      uVar14 = sStack_100 + 3 >> 2;
      puStack_170 = (undefined1 *)((long)dst + uVar14);
      puStack_108 = puStack_170 + uVar14;
      puStack_f8 = puStack_108 + uVar14;
      if (puStack_f8 <= puStack_d8) {
        uVar3 = (uint)*(byte *)((long)DTable + 2);
        sStack_1c0 = BIT_initDStream((BIT_DStream_t *)&HStack_c8,(void *)((long)cSrc + 6),srcSize_00
                                    );
        if (sStack_1c0 < 0xffffffffffffff89) {
          pvVar21 = (void *)((long)cSrc + srcSize_00 + 6);
          sStack_1c0 = BIT_initDStream(&BStack_198,pvVar21,srcSize);
          if (sStack_1c0 < 0xffffffffffffff89) {
            pvVar21 = (void *)((long)pvVar21 + srcSize);
            sStack_1c0 = BIT_initDStream((BIT_DStream_t *)auStack_168,pvVar21,uVar11);
            if ((sStack_1c0 < 0xffffffffffffff89) &&
               (sStack_1c0 = BIT_initDStream((BIT_DStream_t *)auStack_138,
                                             (void *)((long)pvVar21 + uVar11),cSrcSize - uVar12),
               sStack_1c0 < 0xffffffffffffff89)) {
              puStack_d0 = (undefined1 *)((long)dst + (sStack_100 - 3));
              puVar15 = puStack_170;
              puVar18 = puStack_f8;
              puVar25 = puStack_108;
              if (7 < (ulong)((long)puStack_d8 - (long)puStack_f8)) {
                lVar20 = uVar14 * 3;
                bVar28 = true;
                while (((undefined1 *)((long)dst + lVar20) < puStack_d0 && (bVar28))) {
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                  iVar8 = *(byte *)((long)DTable + sVar9 * 2 + 4) + (uint)HStack_c8.ip[1];
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  HStack_c8.ip[1]._0_4_ = iVar8;
                  sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                  uVar17 = *(byte *)((long)DTable + sVar9 * 2 + 4) + BStack_198.bitsConsumed;
                  *(undefined1 *)((long)dst + uVar14) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  BStack_198.bitsConsumed = uVar17;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                  uVar19 = (uint)*(byte *)((long)DTable + sVar9 * 2 + 4) + auStack_168._8_4_;
                  *(undefined1 *)((long)dst + uVar14 * 2) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  auStack_168._8_4_ = uVar19;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                  uVar22 = *(byte *)((long)DTable + sVar9 * 2 + 4) + (uint)pBStack_130;
                  *(undefined1 *)((long)dst + lVar20) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  pBStack_130._0_4_ = uVar22;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                  uStack_ec = (uint)*(byte *)((long)DTable + sVar9 * 2 + 4) + iVar8;
                  *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  HStack_c8.ip[1]._0_4_ = uStack_ec;
                  sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                  BStack_198.bitsConsumed = *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar17;
                  puStack_e8 = (undefined1 *)CONCAT44(puStack_e8._4_4_,BStack_198.bitsConsumed);
                  *(undefined1 *)((long)dst + uVar14 + 1) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                  uVar19 = *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar19;
                  *(undefined1 *)((long)dst + uVar14 * 2 + 1) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  auStack_168._8_4_ = uVar19;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                  uVar22 = *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar22;
                  *(undefined1 *)((long)dst + lVar20 + 1) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  pBStack_130._0_4_ = uVar22;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                  iVar8 = *(byte *)((long)DTable + sVar9 * 2 + 4) + uStack_ec;
                  *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  HStack_c8.ip[1]._0_4_ = iVar8;
                  sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                  uStack_ec = (uint)*(byte *)((long)DTable + sVar9 * 2 + 4) + (int)puStack_e8;
                  *(undefined1 *)((long)dst + uVar14 + 2) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  BStack_198.bitsConsumed = uStack_ec;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                  uStack_dc = *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar19;
                  *(undefined1 *)((long)dst + uVar14 * 2 + 2) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  auStack_168._8_4_ = uStack_dc;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                  uVar22 = *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar22;
                  *(undefined1 *)((long)dst + lVar20 + 2) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  pBStack_130._0_4_ = uVar22;
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                  HStack_c8.ip[1] =
                       (BYTE *)CONCAT44(HStack_c8.ip[1]._4_4_,
                                        (uint)*(byte *)((long)DTable + sVar9 * 2 + 4) + iVar8);
                  puStack_e8 = (undefined1 *)((long)dst + 4);
                  *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                  BStack_198.bitsConsumed = *(byte *)((long)DTable + sVar9 * 2 + 4) + uStack_ec;
                  *(undefined1 *)((long)dst + uVar14 + 3) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                  auStack_168._8_4_ = *(byte *)((long)DTable + sVar9 * 2 + 4) + uStack_dc;
                  *(undefined1 *)((long)dst + uVar14 * 2 + 3) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                  pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                 *(byte *)((long)DTable + sVar9 * 2 + 4) + uVar22);
                  *(undefined1 *)((long)dst + lVar20 + 3) =
                       *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  BVar7 = BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_c8);
                  BVar4 = BIT_reloadDStreamFast(&BStack_198);
                  BVar5 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_168);
                  BVar6 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_138);
                  bVar28 = BVar6 == BIT_DStream_unfinished &&
                           (BVar5 == BIT_DStream_unfinished &&
                           (BVar4 == BIT_DStream_unfinished && BVar7 == BIT_DStream_unfinished));
                  dst = puStack_e8;
                }
                puVar15 = (undefined1 *)((long)dst + uVar14);
                puVar18 = (undefined1 *)((long)dst + lVar20);
                puVar25 = (undefined1 *)((long)dst + uVar14 * 2);
              }
              sStack_1c0 = 0xffffffffffffffec;
              if (puVar25 <= puStack_f8 && (puVar15 <= puStack_108 && dst <= puStack_170)) {
                if ((long)puStack_170 - (long)dst < 4) {
                  if ((uint)HStack_c8.ip[1] < 0x41) {
                    if (HStack_c8.ip[2] < HStack_c8.op[0]) {
                      if (HStack_c8.ip[2] != HStack_c8.ip[3]) {
                        uVar17 = (int)HStack_c8.ip[2] - (int)HStack_c8.ip[3];
                        if (HStack_c8.ip[3] <=
                            HStack_c8.ip[2] + -(ulong)((uint)HStack_c8.ip[1] >> 3)) {
                          uVar17 = (uint)HStack_c8.ip[1] >> 3;
                        }
                        HStack_c8.ip[2] = HStack_c8.ip[2] + -(ulong)uVar17;
                        HStack_c8.ip[1] =
                             (BYTE *)CONCAT44(HStack_c8.ip[1]._4_4_,
                                              (uint)HStack_c8.ip[1] + uVar17 * -8);
                        HStack_c8.ip[0] = *(BYTE **)HStack_c8.ip[2];
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_c8);
                    }
                  }
                }
                else {
                  puVar26 = puStack_170 + -3;
                  while ((uint)HStack_c8.ip[1] < 0x41) {
                    if (HStack_c8.ip[2] < HStack_c8.op[0]) {
                      if (HStack_c8.ip[2] == HStack_c8.ip[3]) break;
                      uVar17 = (int)HStack_c8.ip[2] - (int)HStack_c8.ip[3];
                      if (HStack_c8.ip[2] + -(ulong)((uint)HStack_c8.ip[1] >> 3) >= HStack_c8.ip[3])
                      {
                        uVar17 = (uint)HStack_c8.ip[1] >> 3;
                      }
                      BVar7 = (BIT_DStream_status)
                              (HStack_c8.ip[2] + -(ulong)((uint)HStack_c8.ip[1] >> 3) <
                              HStack_c8.ip[3]);
                      HStack_c8.ip[2] = HStack_c8.ip[2] + -(ulong)uVar17;
                      HStack_c8.ip[1] =
                           (BYTE *)CONCAT44(HStack_c8.ip[1]._4_4_,
                                            (uint)HStack_c8.ip[1] + uVar17 * -8);
                      HStack_c8.ip[0] = *(BYTE **)HStack_c8.ip[2];
                    }
                    else {
                      BVar7 = BIT_reloadDStreamFast((BIT_DStream_t *)&HStack_c8);
                    }
                    if ((puVar26 <= dst) || (BVar7 != BIT_DStream_unfinished)) break;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                    bVar1 = *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    HStack_c8.ip[1]._0_4_ = (uint)HStack_c8.ip[1] + bVar1;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                    HStack_c8.ip[1]._0_4_ =
                         (uint)HStack_c8.ip[1] + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                    HStack_c8.ip[1]._0_4_ =
                         (uint)HStack_c8.ip[1] + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                    HStack_c8.ip[1] =
                         (BYTE *)CONCAT44(HStack_c8.ip[1]._4_4_,
                                          (uint)HStack_c8.ip[1] +
                                          *(byte *)((long)DTable + sVar9 * 2 + 4));
                    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    dst = (void *)((long)dst + 4);
                  }
                }
                for (; puVar26 = puStack_108, dst < puStack_170; dst = (void *)((long)dst + 1)) {
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)&HStack_c8,uVar3);
                  HStack_c8.ip[1] =
                       (BYTE *)CONCAT44(HStack_c8.ip[1]._4_4_,
                                        (uint)HStack_c8.ip[1] +
                                        *(byte *)((long)DTable + sVar9 * 2 + 4));
                  *(undefined1 *)dst = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                }
                if ((long)puStack_108 - (long)puVar15 < 4) {
                  if (BStack_198.bitsConsumed < 0x41) {
                    if (BStack_198.ptr < BStack_198.limitPtr) {
                      if (BStack_198.ptr != BStack_198.start) {
                        uVar17 = (int)BStack_198.ptr - (int)BStack_198.start;
                        if (BStack_198.start <=
                            (U64 *)((long)BStack_198.ptr - (ulong)(BStack_198.bitsConsumed >> 3))) {
                          uVar17 = BStack_198.bitsConsumed >> 3;
                        }
                        BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)uVar17);
                        BStack_198.bitsConsumed = BStack_198.bitsConsumed + uVar17 * -8;
                        BStack_198.bitContainer = *(size_t *)BStack_198.ptr;
                      }
                    }
                    else {
                      BIT_reloadDStreamFast(&BStack_198);
                    }
                  }
                }
                else {
                  puVar27 = puStack_108 + -3;
                  while (puVar26 = puStack_108, BStack_198.bitsConsumed < 0x41) {
                    if (BStack_198.ptr < BStack_198.limitPtr) {
                      if (BStack_198.ptr == BStack_198.start) break;
                      bVar28 = (U64 *)((long)BStack_198.ptr - (ulong)(BStack_198.bitsConsumed >> 3))
                               < BStack_198.start;
                      uVar17 = (int)BStack_198.ptr - (int)BStack_198.start;
                      if (!bVar28) {
                        uVar17 = BStack_198.bitsConsumed >> 3;
                      }
                      BVar7 = (BIT_DStream_status)bVar28;
                      BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)uVar17);
                      BStack_198.bitsConsumed = BStack_198.bitsConsumed + uVar17 * -8;
                      BStack_198.bitContainer = *(size_t *)BStack_198.ptr;
                    }
                    else {
                      BVar7 = BIT_reloadDStreamFast(&BStack_198);
                    }
                    puVar26 = puStack_108;
                    if ((puVar27 <= puVar15) || (BVar7 != BIT_DStream_unfinished)) break;
                    sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                    bVar1 = *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *puVar15 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    BStack_198.bitsConsumed = BStack_198.bitsConsumed + bVar1;
                    sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                    BStack_198.bitsConsumed =
                         BStack_198.bitsConsumed + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar15[1] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                    BStack_198.bitsConsumed =
                         BStack_198.bitsConsumed + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar15[2] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                    BStack_198.bitsConsumed =
                         BStack_198.bitsConsumed + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar15[3] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    puVar15 = puVar15 + 4;
                  }
                }
                for (; puVar27 = puStack_f8, puVar15 < puVar26; puVar15 = puVar15 + 1) {
                  sVar9 = BIT_lookBitsFast(&BStack_198,uVar3);
                  BStack_198.bitsConsumed =
                       BStack_198.bitsConsumed + *(byte *)((long)DTable + sVar9 * 2 + 4);
                  *puVar15 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                  puVar26 = puStack_108;
                }
                if ((long)puStack_f8 - (long)puVar25 < 4) {
                  if ((uint)auStack_168._8_4_ < 0x41) {
                    if (psStack_158 < psStack_148) {
                      if (psStack_158 != psStack_150) {
                        uVar17 = (int)psStack_158 - (int)psStack_150;
                        if (psStack_150 <=
                            (size_t *)((long)psStack_158 - (ulong)((uint)auStack_168._8_4_ >> 3))) {
                          uVar17 = (uint)auStack_168._8_4_ >> 3;
                        }
                        psStack_158 = (size_t *)((long)psStack_158 - (ulong)uVar17);
                        auStack_168._8_4_ = auStack_168._8_4_ + uVar17 * -8;
                        auStack_168._0_8_ = *psStack_158;
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)auStack_168);
                    }
                  }
                }
                else {
                  puVar15 = puStack_f8 + -3;
                  while (puVar27 = puStack_f8, (uint)auStack_168._8_4_ < 0x41) {
                    if (psStack_158 < psStack_148) {
                      if (psStack_158 == psStack_150) break;
                      bVar28 = (size_t *)((long)psStack_158 - (ulong)((uint)auStack_168._8_4_ >> 3))
                               < psStack_150;
                      uVar17 = (int)psStack_158 - (int)psStack_150;
                      if (!bVar28) {
                        uVar17 = (uint)auStack_168._8_4_ >> 3;
                      }
                      BVar7 = (BIT_DStream_status)bVar28;
                      psStack_158 = (size_t *)((long)psStack_158 - (ulong)uVar17);
                      auStack_168._8_4_ = auStack_168._8_4_ + uVar17 * -8;
                      auStack_168._0_8_ = *psStack_158;
                    }
                    else {
                      BVar7 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_168);
                    }
                    puVar27 = puStack_f8;
                    if ((puVar15 <= puVar25) || (BVar7 != BIT_DStream_unfinished)) break;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                    bVar1 = *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *puVar25 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    auStack_168._8_4_ = auStack_168._8_4_ + (uint)bVar1;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                    auStack_168._8_4_ =
                         auStack_168._8_4_ + (uint)*(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar25[1] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                    auStack_168._8_4_ =
                         auStack_168._8_4_ + (uint)*(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar25[2] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                    auStack_168._8_4_ =
                         auStack_168._8_4_ + (uint)*(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar25[3] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    puVar25 = puVar25 + 4;
                  }
                }
                for (; puVar15 = puStack_d8, puVar25 < puVar27; puVar25 = puVar25 + 1) {
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_168,uVar3);
                  auStack_168._8_4_ =
                       auStack_168._8_4_ + (uint)*(byte *)((long)DTable + sVar9 * 2 + 4);
                  *puVar25 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                }
                if ((long)puStack_d8 - (long)puVar18 < 4) {
                  if ((uint)pBStack_130 < 0x41) {
                    if (psStack_128 < psStack_118) {
                      if (psStack_128 != psStack_120) {
                        uVar17 = (int)psStack_128 - (int)psStack_120;
                        if (psStack_120 <=
                            (size_t *)((long)psStack_128 - (ulong)((uint)pBStack_130 >> 3))) {
                          uVar17 = (uint)pBStack_130 >> 3;
                        }
                        psStack_128 = (size_t *)((long)psStack_128 - (ulong)uVar17);
                        pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                       (uint)pBStack_130 + uVar17 * -8);
                        auStack_138 = (undefined1  [8])*psStack_128;
                      }
                    }
                    else {
                      BIT_reloadDStreamFast((BIT_DStream_t *)auStack_138);
                    }
                  }
                }
                else {
                  while ((uint)pBStack_130 < 0x41) {
                    if (psStack_128 < psStack_118) {
                      if (psStack_128 == psStack_120) break;
                      bVar28 = (size_t *)((long)psStack_128 - (ulong)((uint)pBStack_130 >> 3)) <
                               psStack_120;
                      uVar17 = (int)psStack_128 - (int)psStack_120;
                      if (!bVar28) {
                        uVar17 = (uint)pBStack_130 >> 3;
                      }
                      BVar7 = (BIT_DStream_status)bVar28;
                      psStack_128 = (size_t *)((long)psStack_128 - (ulong)uVar17);
                      pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                     (uint)pBStack_130 + uVar17 * -8);
                      auStack_138 = (undefined1  [8])*psStack_128;
                    }
                    else {
                      BVar7 = BIT_reloadDStreamFast((BIT_DStream_t *)auStack_138);
                    }
                    if ((puStack_d0 <= puVar18) || (BVar7 != BIT_DStream_unfinished)) break;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                    bVar1 = *(byte *)((long)DTable + sVar9 * 2 + 4);
                    *puVar18 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    pBStack_130._0_4_ = (uint)pBStack_130 + bVar1;
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                    pBStack_130._0_4_ = (uint)pBStack_130 + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar18[1] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                    pBStack_130._0_4_ = (uint)pBStack_130 + *(byte *)((long)DTable + sVar9 * 2 + 4);
                    puVar18[2] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                    pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                   (uint)pBStack_130 +
                                                   *(byte *)((long)DTable + sVar9 * 2 + 4));
                    puVar18[3] = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                    puVar18 = puVar18 + 4;
                  }
                }
                for (; puVar18 < puVar15; puVar18 = puVar18 + 1) {
                  sVar9 = BIT_lookBitsFast((BIT_DStream_t *)auStack_138,uVar3);
                  pBStack_130 = (BYTE *)CONCAT44(pBStack_130._4_4_,
                                                 (uint)pBStack_130 +
                                                 *(byte *)((long)DTable + sVar9 * 2 + 4));
                  *puVar18 = *(undefined1 *)((long)DTable + sVar9 * 2 + 5);
                }
                sVar9 = 0xffffffffffffffec;
                if ((uint)pBStack_130 != 0x40) {
                  sStack_100 = sVar9;
                }
                if (psStack_128 != psStack_120) {
                  sStack_100 = sVar9;
                }
                if (auStack_168._8_4_ != 0x40) {
                  sStack_100 = sVar9;
                }
                if (psStack_158 != psStack_150) {
                  sStack_100 = sVar9;
                }
                if (BStack_198.bitsConsumed != 0x40) {
                  sStack_100 = sVar9;
                }
                if (BStack_198.ptr != BStack_198.start) {
                  sStack_100 = sVar9;
                }
                if ((uint)HStack_c8.ip[1] != 0x40) {
                  sStack_100 = sVar9;
                }
                sStack_1c0 = sStack_100;
                if (HStack_c8.ip[2] != HStack_c8.ip[3]) {
                  sStack_1c0 = sVar9;
                }
              }
            }
          }
        }
      }
    }
  }
  return sStack_1c0;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}